

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handleapi.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalDuplicateHandle
                    (CPalThread *pThread,HANDLE hSourceProcess,HANDLE hSource,HANDLE hTargetProcess,
                    LPHANDLE phDuplicate,DWORD dwDesiredAccess,BOOL bInheritHandle,DWORD dwOptions)

{
  bool bVar1;
  DWORD DVar2;
  DWORD DVar3;
  DWORD DVar4;
  PAL_ERROR PVar5;
  _func_int **pp_Var6;
  char *pcVar7;
  CPalThread *pThread_00;
  undefined8 uStackY_60;
  _func_int **local_40;
  IPalObject *pobjSource;
  
  local_40 = (_func_int **)0x0;
  pobjSource = (IPalObject *)pThread;
  DVar2 = GetCurrentProcessId();
  DVar3 = PROCGetProcessIDFromHandle(hSourceProcess);
  DVar4 = PROCGetProcessIDFromHandle(hTargetProcess);
  if (DVar4 == 0 || DVar3 == 0) {
    fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
            ,0x7d);
    pcVar7 = "Can\'t duplicate handle: invalid source or destination process";
LAB_00129570:
    fprintf(_stderr,pcVar7);
LAB_00129577:
    PVar5 = 0x57;
    pThread_00 = (CPalThread *)pobjSource;
  }
  else {
    if (DVar4 != DVar2 && DVar3 != DVar2) {
      fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
              ,0x87);
      pcVar7 = 
      "Can\'t duplicate handle : neither source or destinationprocesses are from current process";
      goto LAB_00129570;
    }
    if (bInheritHandle != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
              ,0x8e);
      pcVar7 = "Can\'t duplicate handle : bInheritHandle is not FALSE.\n";
      goto LAB_00129570;
    }
    if (3 < dwOptions) {
      fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
              ,0x9a);
      pcVar7 = 
      "Can\'t duplicate handle : dwOptions is %#x which is not a subset of (DUPLICATE_SAME_ACCESS|DUPLICATE_CLOSE_SOURCE) (%#x).\n"
      ;
      uStackY_60 = 3;
LAB_0012964c:
      fprintf(_stderr,pcVar7,(ulong)dwOptions,uStackY_60);
      goto LAB_00129577;
    }
    if (dwOptions < 2) {
      fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
              ,0xa5);
      pcVar7 = 
      "Can\'t duplicate handle : dwOptions is %#x which does not include DUPLICATE_SAME_ACCESS (%#x).\n"
      ;
      uStackY_60 = 2;
      goto LAB_0012964c;
    }
    if (phDuplicate == (LPHANDLE)0x0) {
      PVar5 = 0;
      fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
              ,0xac);
      fprintf(_stderr,"Can\'t duplicate handle : lpTargetHandle is NULL.\n");
      pThread_00 = (CPalThread *)pobjSource;
    }
    else if (DVar3 == DVar2 && DVar4 == DVar2) {
      bVar1 = HandleIsSpecial(hSource);
      if (bVar1) {
        if ((undefined1 *)hSource == &DAT_ffffff01) {
          pp_Var6 = g_pobjProcess;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001297f6;
        }
        else {
          if ((undefined1 *)hSource != &DAT_ffffff03) {
            fprintf(_stderr,"] %s %s:%d","InternalDuplicateHandle",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handleapi.cpp"
                    ,0xe4);
            fprintf(_stderr,"Duplication not supported for this special handle (%p)\n",hSource);
            PVar5 = 6;
            pThread_00 = (CPalThread *)pobjSource;
            goto LAB_0012957f;
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001297f6;
          pp_Var6 = pobjSource[0x16]._vptr_IPalObject;
        }
        local_40 = pp_Var6;
        (**(code **)(*pp_Var6 + 0x38))(pp_Var6);
      }
      else {
        PVar5 = (**(code **)(*g_pObjectManager + 0x28))
                          (g_pObjectManager,pobjSource,hSource,&aotDuplicateHandle,dwDesiredAccess,
                           &local_40);
        pp_Var6 = local_40;
        if (PVar5 != 0) {
          pThread_00 = (CPalThread *)pobjSource;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001297f6;
          goto LAB_0012957f;
        }
      }
      pThread_00 = (CPalThread *)pobjSource;
      PVar5 = (**(code **)(*g_pObjectManager + 0x18))
                        (g_pObjectManager,pobjSource,pp_Var6,dwDesiredAccess,0,0,phDuplicate);
    }
    else {
      *phDuplicate = hSource;
      PVar5 = 0;
      pThread_00 = (CPalThread *)pobjSource;
    }
  }
LAB_0012957f:
  if (local_40 != (_func_int **)0x0) {
    (**(code **)(*local_40 + 0x40))(local_40,pThread_00);
  }
  if ((dwOptions & 1) != 0) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_001297f6:
      abort();
    }
    InternalCloseHandle(pThread_00,hSource);
  }
  return PVar5;
}

Assistant:

PAL_ERROR
CorUnix::InternalDuplicateHandle(
    CPalThread *pThread,
    HANDLE hSourceProcess,
    HANDLE hSource,
    HANDLE hTargetProcess,
    LPHANDLE phDuplicate,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    DWORD dwOptions
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjSource = NULL;
    
    DWORD source_process_id;
    DWORD target_process_id;
    DWORD cur_process_id;

    cur_process_id = GetCurrentProcessId();
    source_process_id = PROCGetProcessIDFromHandle(hSourceProcess);
    target_process_id = PROCGetProcessIDFromHandle(hTargetProcess);

    /* Check validity of process handles */
    if (0 == source_process_id || 0 == target_process_id)
    {
        ASSERT("Can't duplicate handle: invalid source or destination process");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    /* At least source or target process should be the current process. */
    if (source_process_id != cur_process_id
        && target_process_id != cur_process_id)
    {
        ASSERT("Can't duplicate handle : neither source or destination"
               "processes are from current process");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (FALSE != bInheritHandle)
    {
        ASSERT("Can't duplicate handle : bInheritHandle is not FALSE.\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (dwOptions & ~(DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE))
    {
        ASSERT(
            "Can't duplicate handle : dwOptions is %#x which is not "
            "a subset of (DUPLICATE_SAME_ACCESS|DUPLICATE_CLOSE_SOURCE) "
            "(%#x).\n",
            dwOptions,
            DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }
    
    if (0 == (dwOptions & DUPLICATE_SAME_ACCESS))
    {
        ASSERT(
            "Can't duplicate handle : dwOptions is %#x which does not "
            "include DUPLICATE_SAME_ACCESS (%#x).\n",
            dwOptions,
            DUPLICATE_SAME_ACCESS);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalDuplicateHandleExit;
    }

    if (NULL == phDuplicate)
    {
        ASSERT("Can't duplicate handle : lpTargetHandle is NULL.\n");
        goto InternalDuplicateHandleExit;
    }

    /* Since handles can be remoted to others processes using PAL_LocalHsndleToRemote
       and PAL_RemoteHandleToLocal, DuplicateHandle needs some special handling
       when this scenario occurs.

       if hSourceProcessHandle is from another process OR
       hTargetProcessHandle is from another process but both aren't
       ( handled above ) return hSourceHandle.
    */
    if (source_process_id != cur_process_id
        || target_process_id != cur_process_id)
    {
        *phDuplicate = hSource;
        palError = NO_ERROR;
        goto InternalDuplicateHandleExit;
    }

    //
    // Obtain the source IPalObject
    //

    if (!HandleIsSpecial(hSource))
    {
        palError = g_pObjectManager->ReferenceObjectByHandle(
            pThread,
            hSource,
            &aotDuplicateHandle,
            dwDesiredAccess,
            &pobjSource
            );

        if (NO_ERROR != palError)
        {
            ERROR("Unable to get object for source handle %p (%i)\n", hSource, palError);
            goto InternalDuplicateHandleExit;
        }            
    }
    else if (hPseudoCurrentProcess == hSource)
    {
        TRACE("Duplicating process pseudo handle(%p)\n", hSource);

        pobjSource = g_pobjProcess;
        pobjSource->AddReference();
    }
    else if (hPseudoCurrentThread == hSource)
    {
        TRACE("Duplicating thread pseudo handle(%p)\n", hSource);

        pobjSource = pThread->GetThreadObject();
        pobjSource->AddReference();
    }
    else
    {
        ASSERT("Duplication not supported for this special handle (%p)\n", hSource);
        palError = ERROR_INVALID_HANDLE;
        goto InternalDuplicateHandleExit;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pThread,
        pobjSource,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phDuplicate
        );

InternalDuplicateHandleExit:

    if (NULL != pobjSource)
    {
        pobjSource->ReleaseReference(pThread);
    }

    if (dwOptions & DUPLICATE_CLOSE_SOURCE)
    {
        //
        // Since DUPLICATE_CLOSE_SOURCE was specified the source handle
        // MUST be closed, even if an error occurred during the duplication
        // process
        //
        
        TRACE("DuplicateHandle closing source handle %p\n", hSource);
        InternalCloseHandle(pThread, hSource);
    }

    return palError;
}